

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

char * GetDirectoryPath(char *filePath)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  char *lastSlash;
  char *filePath_local;
  
  memset(GetDirectoryPath::dirPath,0,0x1000);
  if (((filePath[1] != ':') && (*filePath != '\\')) && (*filePath != '/')) {
    GetDirectoryPath::dirPath[0] = '.';
    GetDirectoryPath::dirPath[1] = '/';
  }
  __s = strprbrk(filePath,"\\/");
  if (__s != (char *)0x0) {
    if (__s == filePath) {
      GetDirectoryPath::dirPath[0] = *filePath;
      GetDirectoryPath::dirPath[1] = '\0';
    }
    else {
      bVar4 = false;
      if ((filePath[1] != ':') && (bVar4 = false, *filePath != '\\')) {
        bVar4 = *filePath != '/';
      }
      iVar1 = 0;
      if (bVar4) {
        iVar1 = 2;
      }
      sVar2 = strlen(filePath);
      sVar3 = strlen(__s);
      memcpy(GetDirectoryPath::dirPath + iVar1,filePath,sVar2 - (sVar3 - 1));
      sVar2 = strlen(filePath);
      sVar3 = strlen(__s);
      bVar4 = false;
      if ((filePath[1] != ':') && (bVar4 = false, *filePath != '\\')) {
        bVar4 = *filePath != '/';
      }
      iVar1 = 0;
      if (bVar4) {
        iVar1 = 2;
      }
      GetDirectoryPath::dirPath[(sVar2 - sVar3) + (long)iVar1] = '\0';
    }
  }
  return GetDirectoryPath::dirPath;
}

Assistant:

const char *GetDirectoryPath(const char *filePath)
{
/*
    // NOTE: Directory separator is different in Windows and other platforms,
    // fortunately, Windows also support the '/' separator, that's the one should be used
    #if defined(_WIN32)
        char separator = '\\';
    #else
        char separator = '/';
    #endif
*/
    const char *lastSlash = NULL;
    static char dirPath[MAX_FILEPATH_LENGTH];
    memset(dirPath, 0, MAX_FILEPATH_LENGTH);

    // In case provided path does not contain a root drive letter (C:\, D:\) nor leading path separator (\, /),
    // we add the current directory path to dirPath
    if (filePath[1] != ':' && filePath[0] != '\\' && filePath[0] != '/')
    {
        // For security, we set starting path to current directory,
        // obtained path will be concated to this
        dirPath[0] = '.';
        dirPath[1] = '/';
    }

    lastSlash = strprbrk(filePath, "\\/");
    if (lastSlash)
    {
        if (lastSlash == filePath)
        {
            // The last and only slash is the leading one: path is in a root directory
            dirPath[0] = filePath[0];
            dirPath[1] = '\0';
        }
        else
        {
            // NOTE: Be careful, strncpy() is not safe, it does not care about '\0'
            memcpy(dirPath + (filePath[1] != ':' && filePath[0] != '\\' && filePath[0] != '/' ? 2 : 0), filePath, strlen(filePath) - (strlen(lastSlash) - 1));
            dirPath[strlen(filePath) - strlen(lastSlash) + (filePath[1] != ':' && filePath[0] != '\\' && filePath[0] != '/' ? 2 : 0)] = '\0';  // Add '\0' manually
        }
    }

    return dirPath;
}